

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsScene::itemsBoundingRect(QRectF *__return_storage_ptr__,QGraphicsScene *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRectF QStack_68;
  QArrayDataPointer<QGraphicsItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->w = 0.0;
  __return_storage_ptr__->h = 0.0;
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
            (&local_48,*(long **)(*(long *)(this + 8) + 0x88),1);
  lVar1 = CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
  lVar2 = local_48.size << 3;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 8) {
    QGraphicsItem::sceneBoundingRect(&QStack_68,*(QGraphicsItem **)(lVar1 + lVar3));
    QRectF::operator|=(__return_storage_ptr__,&QStack_68);
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsScene::itemsBoundingRect() const
{
    // Does not take untransformable items into account.
    QRectF boundingRect;
    const auto items_ = items();
    for (QGraphicsItem *item : items_)
        boundingRect |= item->sceneBoundingRect();
    return boundingRect;
}